

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

errc psql::deserialize<psql::row_description>(row_description *output,deserialization_context *ctx)

{
  errc eVar1;
  ulong in_RAX;
  long lVar2;
  long lVar3;
  int16_t num_fields;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffff;
  eVar1 = serialization_traits<short,_(psql::serialization_tag)1>::deserialize_
                    ((short *)((long)&uStack_28 + 6),ctx);
  if (eVar1 == ok) {
    std::vector<psql::single_row_description,_std::allocator<psql::single_row_description>_>::resize
              (&output->rows,(long)uStack_28._6_2_);
    if (0 < uStack_28._6_2_) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        eVar1 = deserialize_struct<0ul,psql::single_row_description>
                          ((single_row_description *)
                           ((long)&(((output->rows).
                                     super__Vector_base<psql::single_row_description,_std::allocator<psql::single_row_description>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name).
                                   super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>
                           + lVar3),ctx);
        if (eVar1 != ok) {
          return eVar1;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x28;
      } while (lVar2 < uStack_28._6_2_);
    }
    eVar1 = ok;
  }
  return eVar1;
}

Assistant:

errc deserialize(T& output, deserialization_context& ctx) noexcept
{
	return serialization_traits<T>::deserialize_(output, ctx);
}